

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O2

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>,double>
               (AVisitor<hiberlite::UpdateBean> *ar,
               set<double,_std::less<double>,_std::allocator<double>_> *m,uint param_3)

{
  _Base_ptr p_Var1;
  allocator local_b1;
  string local_b0 [32];
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  local_90;
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  local_58;
  
  std::__cxx11::string::string(local_b0,"items",&local_b1);
  p_Var1 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_58,local_b0);
  local_58.stream.ct = m;
  local_58.stream.it._M_node = p_Var1;
  std::__cxx11::string::~string(local_b0);
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  ::collection_nvp(&local_90,&local_58);
  AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void hibernate(A& ar, std::set<Key>& m, const unsigned int)
{
	typedef Key ElType;
	collection_nvp<ElType,stl_stream_adapter<ElType,std::set<Key> > >
			body( "items", stl_stream_adapter<ElType,std::set<Key> >(m) );
	ar & body;
}